

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O1

int adl_removeBank(ADL_MIDIPlayer *device,ADL_Bank *bank)

{
  long lVar1;
  Slot *slot;
  long lVar2;
  Slot *pSVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -1;
  if (bank != (ADL_Bank *)0x0 && device != (ADL_MIDIPlayer *)0x0) {
    if (device->adl_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x142,"int adl_removeBank(ADL_MIDIPlayer *, ADL_Bank *)");
    }
    lVar1 = *(long *)((long)device->adl_midiPlayer + 0x198);
    slot = (Slot *)bank->pointer[1];
    lVar2 = *(long *)(lVar1 + 0xd0);
    BasicBankMap<OPL3::Bank>::bucket_remove
              ((BasicBankMap<OPL3::Bank> *)(lVar1 + 0xa0),(size_t)bank->pointer[2],slot);
    pSVar3 = *(Slot **)(lVar1 + 200);
    if (pSVar3 != (Slot *)0x0) {
      pSVar3->prev = slot;
    }
    slot->prev = (Slot *)0x0;
    slot->next = pSVar3;
    *(Slot **)(lVar1 + 200) = slot;
    memset(&(slot->value).second,0,0x1380);
    lVar5 = *(long *)(lVar1 + 0xd0) + -1;
    *(long *)(lVar1 + 0xd0) = lVar5;
    iVar4 = -(uint)(lVar5 == lVar2);
  }
  return iVar4;
}

Assistant:

ADLMIDI_EXPORT int adl_removeBank(ADL_MIDIPlayer *device, ADL_Bank *bank)
{
    if(!device || !bank)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;
    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    size_t size = map.size();
    map.erase(it);
    return (map.size() != size) ? 0 : -1;
}